

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptTextureType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  EHlslTokenClass EVar5;
  TLayoutFormat TVar6;
  uint uVar7;
  int iVar8;
  TTypeList *pTVar9;
  undefined4 extraout_var;
  uint uVar10;
  char *pcVar11;
  byte bVar12;
  uint local_17c;
  TSampler sampler;
  undefined1 local_174;
  TIntermTyped *local_168;
  TType txType;
  TType local_c8;
  
  EVar5 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  switch(EVar5) {
  case EHTokTexture1d:
    local_17c = 0x100;
    break;
  case EHTokTexture1darray:
    local_17c = 0x100;
    goto LAB_0033329a;
  case EHTokTexture2d:
    local_17c = 0x200;
    break;
  case EHTokTexture2darray:
    local_17c = 0x200;
    goto LAB_0033329a;
  case EHTokTexture3d:
    local_17c = 0x300;
    break;
  case EHTokTextureCube:
    local_17c = 0x400;
    break;
  case EHTokTextureCubearray:
    local_17c = 0x400;
LAB_0033329a:
    uVar10 = 0x10000;
    bVar2 = false;
    bVar12 = 0;
    goto LAB_003332d9;
  case EHTokTexture2DMS:
    local_17c = 0x200;
    bVar2 = false;
    bVar12 = 1;
    goto LAB_0033328d;
  case EHTokTexture2DMSarray:
    local_17c = 0x200;
    uVar10 = 0x10000;
    bVar2 = false;
    bVar12 = 1;
    goto LAB_003332d9;
  case EHTokRWTexture1d:
    local_17c = 0x100;
    goto LAB_00333284;
  case EHTokRWTexture1darray:
    local_17c = 0x100;
    goto LAB_003332b2;
  case EHTokRWTexture2d:
    local_17c = 0x200;
    goto LAB_00333284;
  case EHTokRWTexture2darray:
    local_17c = 0x200;
LAB_003332b2:
    uVar10 = 0x10000;
    bVar2 = true;
    bVar12 = 0;
    goto LAB_003332d9;
  case EHTokRWTexture3d:
    local_17c = 0x300;
LAB_00333284:
    bVar12 = 0;
    bVar2 = true;
    goto LAB_0033328d;
  case EHTokRWBuffer:
    local_17c = 0x600;
    bVar12 = 0;
    bVar2 = true;
    bVar1 = true;
    uVar10 = 0;
    bVar4 = true;
    goto LAB_003332dc;
  default:
    local_17c = 0x600;
    bVar4 = true;
    bVar2 = false;
    bVar1 = false;
    bVar12 = 0;
    uVar10 = 0;
    if (EVar5 != EHTokBuffer) {
      return false;
    }
    goto LAB_003332dc;
  }
  bVar2 = false;
  bVar12 = 0;
LAB_0033328d:
  uVar10 = 0;
LAB_003332d9:
  bVar1 = true;
  bVar4 = false;
LAB_003332dc:
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  TType::TType(&txType,EbtFloat,EvqUniform,4,0,0,false);
  bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (bVar3) {
    bVar3 = acceptType(this,&txType);
    if (bVar3) {
      if ((0xf < txType._8_1_) || ((0x8302U >> (txType._8_4_ & 0x1f) & 1) == 0)) {
        pcVar11 = "basic type in texture";
LAB_003334c2:
        unimplemented(this,pcVar11);
        return false;
      }
      if (bVar4 && (txType._8_4_ & 0xf000) != 0) {
        if (((uint)txType._8_4_ >> 0x10 & 0xf) * ((uint)txType._8_4_ >> 0xc & 0xf) < 5) {
          pcVar11 = "matrix type in buffer";
          goto LAB_003334c2;
        }
        pcVar11 = "components < 4 in matrix buffer type";
      }
      else {
        bVar3 = TType::isScalar(&txType);
        if (((bVar3) || ((txType._8_4_ & 0x100e00) != 0)) || ((txType._8_4_ & 0xff) - 0xf < 2)) {
          if ((bVar12 != 0) &&
             (bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma),
             bVar3)) {
            bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
            if (!bVar3) {
              pcVar11 = "multisample count";
              goto LAB_00333561;
            }
            bVar3 = acceptLiteral(this,&local_168);
            if (!bVar3) {
              return false;
            }
          }
          bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
          if (bVar3) goto LAB_00333426;
          pcVar11 = "right angle bracket";
        }
        else {
          pcVar11 = "scalar, vector, or struct type";
        }
      }
    }
    else {
      pcVar11 = "scalar or vector type";
    }
  }
  else if (bVar12 == 0) {
    if (!bVar2) {
LAB_00333426:
      if ((bool)(bVar2 | bVar4)) {
        TVar6 = HlslParseContext::getLayoutFromTxType
                          (this->parseContext,&(this->super_HlslTokenStream).token.loc,&txType);
        local_174 = (undefined1)TVar6;
      }
      else {
        local_174 = 0;
      }
      uVar7 = txType._8_4_;
      if ((txType._8_4_ & 0xff) - 0xf < 2) {
        pTVar9 = TType::getStruct(&txType);
        uVar7 = (*((pTVar9->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[7])();
      }
      if (bVar4 && !bVar2) {
        sampler = (TSampler)((byte)txType._8_1_ + uVar10 + 0x1f100600);
      }
      else {
        uVar10 = (uint)bVar12 << 0x12 | uVar10;
        if (bVar2) {
          sampler = (TSampler)(uVar10 | local_17c | uVar7 & 0xff | 0x1f080000);
        }
        else {
          sampler = (TSampler)(uVar10 | local_17c | uVar7 & 0xff | 0x1f000000);
        }
      }
      bVar4 = HlslParseContext::setTextureReturnType
                        (this->parseContext,&sampler,&txType,
                         &(this->super_HlslTokenStream).token.loc);
      if (bVar4) {
        if (!bVar1) {
          sampler = (TSampler)((uint)sampler & 0xffefffff);
        }
        TType::TType(&local_c8,&sampler,EvqUniform,(TArraySizes *)0x0);
        TType::shallowCopy(type,&local_c8);
        iVar8 = (*type->_vptr_TType[10])(type);
        *(undefined1 *)(CONCAT44(extraout_var,iVar8) + 0x2c) = local_174;
        return bVar4;
      }
      return bVar4;
    }
    pcVar11 = "type for RWTexture/RWBuffer";
  }
  else {
    pcVar11 = "texture type for multisample";
  }
LAB_00333561:
  expected(this,pcVar11);
  return false;
}

Assistant:

bool HlslGrammar::acceptTextureType(TType& type)
{
    const EHlslTokenClass textureType = peek();

    TSamplerDim dim = EsdNone;
    bool array = false;
    bool ms    = false;
    bool image = false;
    bool combined = true;

    switch (textureType) {
    case EHTokBuffer:            dim = EsdBuffer; combined = false;    break;
    case EHTokTexture1d:         dim = Esd1D;                          break;
    case EHTokTexture1darray:    dim = Esd1D; array = true;            break;
    case EHTokTexture2d:         dim = Esd2D;                          break;
    case EHTokTexture2darray:    dim = Esd2D; array = true;            break;
    case EHTokTexture3d:         dim = Esd3D;                          break;
    case EHTokTextureCube:       dim = EsdCube;                        break;
    case EHTokTextureCubearray:  dim = EsdCube; array = true;          break;
    case EHTokTexture2DMS:       dim = Esd2D; ms = true;               break;
    case EHTokTexture2DMSarray:  dim = Esd2D; array = true; ms = true; break;
    case EHTokRWBuffer:          dim = EsdBuffer; image=true;          break;
    case EHTokRWTexture1d:       dim = Esd1D; array=false; image=true; break;
    case EHTokRWTexture1darray:  dim = Esd1D; array=true;  image=true; break;
    case EHTokRWTexture2d:       dim = Esd2D; array=false; image=true; break;
    case EHTokRWTexture2darray:  dim = Esd2D; array=true;  image=true; break;
    case EHTokRWTexture3d:       dim = Esd3D; array=false; image=true; break;
    default:
        return false;  // not a texture declaration
    }

    advanceToken();  // consume the texture object keyword

    TType txType(EbtFloat, EvqUniform, 4); // default type is float4

    TIntermTyped* msCount = nullptr;

    // texture type: required for multisample types and RWBuffer/RWTextures!
    if (acceptTokenClass(EHTokLeftAngle)) {
        if (! acceptType(txType)) {
            expected("scalar or vector type");
            return false;
        }

        const TBasicType basicRetType = txType.getBasicType() ;

        switch (basicRetType) {
        case EbtFloat:
        case EbtUint:
        case EbtInt:
        case EbtStruct:
            break;
        default:
            unimplemented("basic type in texture");
            return false;
        }

        // Buffers can handle small mats if they fit in 4 components
        if (dim == EsdBuffer && txType.isMatrix()) {
            if ((txType.getMatrixCols() * txType.getMatrixRows()) > 4) {
                expected("components < 4 in matrix buffer type");
                return false;
            }

            // TODO: except we don't handle it yet...
            unimplemented("matrix type in buffer");
            return false;
        }

        if (!txType.isScalar() && !txType.isVector() && !txType.isStruct()) {
            expected("scalar, vector, or struct type");
            return false;
        }

        if (ms && acceptTokenClass(EHTokComma)) {
            // read sample count for multisample types, if given
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("multisample count");
                return false;
            }

            if (! acceptLiteral(msCount))  // should never fail, since we just found an integer
                return false;
        }

        if (! acceptTokenClass(EHTokRightAngle)) {
            expected("right angle bracket");
            return false;
        }
    } else if (ms) {
        expected("texture type for multisample");
        return false;
    } else if (image) {
        expected("type for RWTexture/RWBuffer");
        return false;
    }

    TArraySizes* arraySizes = nullptr;
    const bool shadow = false; // declared on the sampler

    TSampler sampler;
    TLayoutFormat format = ElfNone;

    // Buffer, RWBuffer and RWTexture (images) require a TLayoutFormat.  We handle only a limit set.
    if (image || dim == EsdBuffer)
        format = parseContext.getLayoutFromTxType(token.loc, txType);

    const TBasicType txBasicType = txType.isStruct() ? (*txType.getStruct())[0].type->getBasicType()
        : txType.getBasicType();

    // Non-image Buffers are combined
    if (dim == EsdBuffer && !image) {
        sampler.set(txType.getBasicType(), dim, array);
    } else {
        // DX10 textures are separated.  TODO: DX9.
        if (image) {
            sampler.setImage(txBasicType, dim, array, shadow, ms);
        } else {
            sampler.setTexture(txBasicType, dim, array, shadow, ms);
        }
    }

    // Remember the declared return type.  Function returns false on error.
    if (!parseContext.setTextureReturnType(sampler, txType, token.loc))
        return false;

    // Force uncombined, if necessary
    if (!combined)
        sampler.combined = false;

    type.shallowCopy(TType(sampler, EvqUniform, arraySizes));
    type.getQualifier().layoutFormat = format;

    return true;
}